

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3d>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *dest)

{
  undefined8 uVar1;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *this;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  string local_d8;
  expected_lite local_b8 [32];
  undefined1 local_98 [40];
  size_t k;
  undefined8 uStack_68;
  int32_t idx;
  size_t i;
  undefined1 local_58 [7];
  bool valid;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  unexpected_type<const_char_*> local_38;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *local_30;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *dest_local;
  vector<int,_std::allocator<int>_> *indices_local;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *pvStack_18;
  uint32_t elementSize_local;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *values_local;
  
  local_30 = dest;
  dest_local = (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
               indices;
  indices_local._4_4_ = elementSize;
  pvStack_18 = values;
  values_local = (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 __return_storage_ptr__;
  if (dest == (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0) {
    local_38 = nonstd::expected_lite::make_unexpected<char_const(&)[19]>
                         ((char (*) [19])"`dest` is nullptr.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_38);
  }
  else {
    bVar2 = ::std::vector<int,_std::allocator<int>_>::empty(indices);
    if (bVar2) {
      ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::operator=
                (local_30,pvStack_18);
      invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<bool,_0>(__return_storage_ptr__,
                          (bool *)((long)&invalidIndices.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    else if (indices_local._4_4_ == 0) {
      invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<bool,_0>(__return_storage_ptr__,
                          (bool *)((long)&invalidIndices.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    }
    else {
      sVar4 = ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
              size(pvStack_18);
      this = local_30;
      if (sVar4 % (ulong)indices_local._4_4_ == 0) {
        sVar4 = ::std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)dest_local);
        ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::resize
                  (this,sVar4 * indices_local._4_4_);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
        i._7_1_ = 1;
        for (uStack_68 = 0; uVar1 = uStack_68,
            sVar4 = ::std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)dest_local),
            (ulong)uVar1 < sVar4; uStack_68 = uStack_68 + 1) {
          pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)dest_local,uStack_68);
          k._4_4_ = *pvVar5;
          if ((k._4_4_ < 0) ||
             (iVar3 = k._4_4_ + 1, uVar8 = (ulong)indices_local._4_4_,
             sVar4 = ::std::
                     vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
                     size(pvStack_18), sVar4 < (long)iVar3 * uVar8)) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                       &stack0xffffffffffffff98);
            i._7_1_ = 0;
          }
          else {
            for (local_98._32_8_ = 0; (ulong)local_98._32_8_ < (ulong)indices_local._4_4_;
                local_98._32_8_ = local_98._32_8_ + 1) {
              pvVar6 = ::std::
                       vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
                       operator[](pvStack_18,
                                  (long)k._4_4_ * (ulong)indices_local._4_4_ + local_98._32_8_);
              pvVar7 = ::std::
                       vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
                       operator[](local_30,uStack_68 * (ulong)indices_local._4_4_ + local_98._32_8_)
              ;
              pvVar7->r = pvVar6->r;
              pvVar7->g = pvVar6->g;
              pvVar7->b = pvVar6->b;
            }
          }
        }
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
        if (sVar4 == 0) {
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<bool,_0>(__return_storage_ptr__,(bool *)((long)&i + 7));
        }
        else {
          tinyusdz::value::print_array_snipped<unsigned_long>
                    (&local_d8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,5);
          ::std::operator+((char *)local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Invalid indices found: ");
          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                    ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_98,local_b8,value);
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,
                     (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_98);
          nonstd::expected_lite::
          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_98);
          ::std::__cxx11::string::~string((string *)local_b8);
          ::std::__cxx11::string::~string((string *)&local_d8);
        }
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
      }
      else {
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<bool,_0>(__return_storage_ptr__,
                            (bool *)((long)&invalidIndices.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 5))
        ;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}